

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

void __thiscall
CoreML::Specification::ScaleLayerParams::_internal_add_shapebias
          (ScaleLayerParams *this,uint64_t value)

{
  uint64_t local_18;
  uint64_t value_local;
  ScaleLayerParams *this_local;
  
  local_18 = value;
  value_local = (uint64_t)this;
  google::protobuf::RepeatedField<unsigned_long>::Add(&this->shapebias_,&local_18);
  return;
}

Assistant:

inline void ScaleLayerParams::_internal_add_shapebias(uint64_t value) {
  shapebias_.Add(value);
}